

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFeeder.cpp
# Opt level: O1

bool __thiscall
chrono::ChFeeder::IntLoadConstraint_Ct(unsigned_int,Eigen::Matrix<double,-1,1,0,-1,1>&,double)::
MyContactCallback::OnReportContact(chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChMatrix33<double>const&,double_const&,double_const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChContactable*,chrono::
ChContactable__int_(void *this,ChVector<double> *pA,ChVector<double> *pB,
                   ChMatrix33<double> *plane_coord,double *distance,double *eff_radius,
                   ChVector<double> *react_forces,ChVector<double> *react_torques,
                   ChContactable *contactobjA,ChContactable *contactobjB,int offset)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChContactable *pCVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ChContactable *pCVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double local_48;
  double local_40;
  double local_38;
  
  pCVar10 = *(ChContactable **)(*(long *)((long)this + 8) + 0x78);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)((long)this + 8) + 0x80);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (pCVar10 == contactobjA) {
    bVar19 = true;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  }
  else {
    pCVar11 = *(ChContactable **)(*(long *)((long)this + 8) + 0x78);
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)((long)this + 8) + 0x80);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    bVar19 = pCVar11 == contactobjB;
  }
  if ((pCVar10 != contactobjA) && (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (!bVar19) {
    return true;
  }
  ChTransform<double>::TransformParentToLocal
            (pB,(ChVector<double> *)(*(long *)((long)this + 8) + 0x90),
             (ChMatrix33<double> *)(*(long *)((long)this + 8) + 200));
  lVar12 = *(long *)((long)this + 8);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(double *)(lVar12 + 0x128);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(double *)(lVar12 + 0x130);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(double *)(lVar12 + 0x138);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_38;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_48;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_40;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_40 * *(double *)(lVar12 + 0x138);
  auVar16 = vfmsub231sd_fma(auVar39,auVar23,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_38 * *(double *)(lVar12 + 0x128);
  auVar17 = vfmsub231sd_fma(auVar30,auVar35,auVar27);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_48 * *(double *)(lVar12 + 0x130);
  auVar18 = vfmsub231sd_fma(auVar24,auVar20,auVar38);
  dVar22 = auVar16._0_8_ + *(double *)(lVar12 + 0x110);
  dVar14 = auVar17._0_8_ + *(double *)(lVar12 + 0x118);
  dVar15 = auVar18._0_8_ + *(double *)(lVar12 + 0x120);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(lVar12 + 200);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar14 * *(double *)(lVar12 + 0xd0);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar22;
  auVar16 = vfmadd231sd_fma(auVar21,auVar36,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(lVar12 + 0xd8);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar15;
  auVar16 = vfmadd231sd_fma(auVar16,auVar31,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(lVar12 + 0xe0);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar14 * *(double *)(lVar12 + 0xe8);
  auVar17 = vfmadd231sd_fma(auVar25,auVar36,auVar18);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(lVar12 + 0xf0);
  auVar17 = vfmadd231sd_fma(auVar17,auVar31,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(lVar12 + 0xf8);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar14 * *(double *)(lVar12 + 0x100);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar22;
  auVar18 = vfmadd231sd_fma(auVar28,auVar37,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(lVar12 + 0x108);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar15;
  auVar18 = vfmadd231sd_fma(auVar18,auVar32,auVar3);
  dVar22 = auVar17._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       dVar22 * (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar17 = vfmadd231sd_fma(auVar33,auVar16,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar5);
  bVar19 = auVar17._0_8_ < 0.0;
  if (-1 < offset) {
    lVar12 = (*(long **)((long)this + 0x10))[1];
    if (offset < lVar12) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           dVar22 * (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
      auVar17 = vfmadd231sd_fma(auVar34,auVar16,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
      auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           dVar22 * (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
      auVar16 = vfmadd231sd_fma(auVar26,auVar16,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar16 = vfmadd231sd_fma(auVar16,auVar18,auVar9);
      lVar13 = **(long **)((long)this + 0x10);
      *(double *)(lVar13 + (long)offset * 8) = *(double *)((long)this + 0x18) * 0.0;
      if ((long)(ulong)(offset + 1) < lVar12) {
        *(double *)(lVar13 + (ulong)(offset + 1) * 8) =
             (double)((ulong)bVar19 * auVar17._0_8_ +
                     (ulong)!bVar19 * (auVar17._0_8_ ^ 0x8000000000000000)) *
             *(double *)((long)this + 0x18);
        if ((long)(ulong)(offset + 2) < lVar12) {
          *(double *)(lVar13 + (ulong)(offset + 2) * 8) =
               (double)((ulong)bVar19 * auVar16._0_8_ +
                       (ulong)!bVar19 * (auVar16._0_8_ ^ 0x8000000000000000)) *
               *(double *)((long)this + 0x18);
          return true;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

virtual bool OnReportContact(
                const ChVector<>& pA,             ///< contact pA
                const ChVector<>& pB,             ///< contact pB
                const ChMatrix33<>& plane_coord,  ///< contact plane coordsystem (A column 'X' is contact normal)
                const double& distance,           ///< contact distance
                const double& eff_radius,         ///< effective radius of curvature at contact
                const ChVector<>& react_forces,   ///< react.forces (if already computed). In coordsystem 'plane_coord'
                const ChVector<>& react_torques,  ///< react.torques, if rolling friction (if already computed).
                ChContactable* contactobjA,  ///< model A (note: some containers may not support it and could be nullptr)
                ChContactable* contactobjB,  ///< model B (note: some containers may not support it and could be nullptr)
                const int offset  ///< offset of the first constraint (the normal component) in the vector of lagrangian multipliers, if already book-keeped
            ) {
                // Modify the Ct term in Qc only if the contact is touching a feeder object:
                if ((myfeeder->GetFeederObject().get() == contactobjA) || (myfeeder->GetFeederObject().get() == contactobjB)) {

                    // position of contact respect to the vibration mode reference, defining the screw motion 
                    ChVector<> local_rad = myfeeder->reference.TransformParentToLocal(pB);
                    // speed of the contact point, on the feeder (can be +/-), given the six values of the eigenvector screw motion
                    ChVector<> local_pseudovel = ChVector<>(myfeeder->v_x, myfeeder->v_y, myfeeder->v_z) +
                        Vcross(ChVector<>(myfeeder->w_x, myfeeder->w_y, myfeeder->w_z), local_rad);
                    ChVector<> pseudovel = myfeeder->reference.TransformDirectionLocalToParent(local_pseudovel);
                    // speed in the reference of the contact
                    ChVector<> contact_pseudovel = plane_coord.transpose() * pseudovel;

                    // The -Ct term to impose in the constraint.
                    // Note on signs: the Ct term should be negative for imposing positive contact-relative velocity, because of sign conventions in chrono.
                    ChVector<> contact_Ct; 
                    
                    // Heuristic formula: compute the tangential imposed speed, assuming other object is hit/moved only in ascending direction, and 
                    // assuming the speed is constant in all ascending phase (whereas it would be sinusoidal in reality, but
                    // would need some info on which point of the sinusoid, on average, is hit, and this might require some 
                    // statistical data or some info like gravity acceleration and frequency, which are not needed in the simple formula below)

                    if (contact_pseudovel.x() >= 0)  
                        contact_Ct = -contact_pseudovel;
                    else
                        contact_Ct = contact_pseudovel;

                    // Final touch: set the normal component of Ct as zero, to avoid unnecessary "pop corn" effect, that
                    // should tend to zero anyway in high frequency feeders:
                    contact_Ct.x() = 0;

                    // Write the Ct term in the Qc vector, as required by IntLoadConstraint_Ct
                    (*Qc)(offset) = contact_Ct.x() * c; // Ct =dC/dt term, N normal direction (
                    (*Qc)(offset + 1) = contact_Ct.y() * c; // Ct =dC/dt term, Tu direction 
                    (*Qc)(offset + 2) = contact_Ct.z() * c; // Ct =dC/dt term, Tv direction 
                }
                return true;
            }